

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic1::Run(UnitTest_semantic1 *this)

{
  Terminator *pTVar1;
  Terminator *error;
  Terminator *pTVar2;
  Terminator *d;
  Terminator *c;
  Terminator *b;
  Terminator *a;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  string *in_stack_fffffffffffffd68;
  allocator *paVar3;
  FindName *in_stack_fffffffffffffd70;
  allocator *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffda8;
  UnitTestBase *this_00;
  FindName *in_stack_fffffffffffffdb8;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [64];
  Terminator *local_140;
  allocator local_131;
  string local_130 [64];
  Terminator *local_f0;
  undefined1 local_e1 [65];
  Terminator *local_a0;
  allocator local_91;
  string local_90 [64];
  Terminator *local_50;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a, b = c, d",&local_31);
  anon_unknown.dwarf_fc1b::Semantic(in_stack_fffffffffffffda8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  paVar3 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"a",paVar3);
  FindName::FindName(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  pTVar1 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)paVar3
                      ,in_stack_fffffffffffffdb8);
  FindName::~FindName((FindName *)0x1a3077);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  this_00 = (UnitTestBase *)local_e1;
  local_50 = pTVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e1 + 1),"b",(allocator *)this_00);
  FindName::FindName(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  error = ASTFind<luna::Terminator,FindName>
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)paVar3,
                     (FindName *)pTVar1);
  FindName::~FindName((FindName *)0x1a310b);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  local_a0 = error;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"c",&local_131);
  FindName::FindName(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  pTVar2 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)paVar3
                      ,(FindName *)pTVar1);
  FindName::~FindName((FindName *)0x1a319f);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_f0 = pTVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"d",&local_181);
  FindName::FindName(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  pTVar1 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)paVar3
                      ,(FindName *)pTVar1);
  FindName::~FindName((FindName *)0x1a3233);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  local_140 = pTVar1;
  if (local_50->semantic_ != SemanticOp_Write) {
    in_stack_fffffffffffffd80 = &local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1a8,"\'a->semantic_ == luna::SemanticOp_Write\'",in_stack_fffffffffffffd80);
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  }
  if (local_a0->semantic_ != SemanticOp_Write) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"\'b->semantic_ == luna::SemanticOp_Write\'",&local_1d1);
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  if (local_f0->semantic_ != SemanticOp_Read) {
    paVar3 = &local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"\'c->semantic_ == luna::SemanticOp_Read\'",paVar3);
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  if (local_140->semantic_ != SemanticOp_Read) {
    paVar3 = &local_221;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"\'d->semantic_ == luna::SemanticOp_Read\'",paVar3);
    UnitTestBase::Error(this_00,(string *)error);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
  }
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_fffffffffffffd80);
  return;
}

Assistant:

TEST_CASE(semantic1)
{
    auto ast = Semantic("a, b = c, d");
    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    auto b = ASTFind<luna::Terminator>(ast, FindName("b"));
    auto c = ASTFind<luna::Terminator>(ast, FindName("c"));
    auto d = ASTFind<luna::Terminator>(ast, FindName("d"));
    EXPECT_TRUE(a->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(b->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(c->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(d->semantic_ == luna::SemanticOp_Read);
}